

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,string *item)

{
  RegularExpression *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string fw;
  string full_fw;
  string local_1d0;
  cmOutputConverter converter;
  string fw_path;
  
  this_00 = &this->SplitFramework;
  bVar1 = cmsys::RegularExpression::find(this_00,item);
  if (bVar1) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&fw_path,&this_00->regmatch,1);
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&fw,&this_00->regmatch,2);
    std::__cxx11::string::string((string *)&full_fw,(string *)&fw_path);
    std::__cxx11::string::append((char *)&full_fw);
    std::__cxx11::string::append((string *)&full_fw);
    std::__cxx11::string::append((char *)&full_fw);
    std::__cxx11::string::append((char *)&full_fw);
    std::__cxx11::string::append((string *)&full_fw);
    AddFrameworkPath(this,&fw_path);
    AddLibraryRuntimeInfo(this,&full_fw);
    converter.StateSnapshot.State._0_1_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<char_const(&)[11],bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(char (*) [11])"-framework",(bool *)&converter);
    cmMakefile::GetStateSnapshot(this->Makefile);
    cmOutputConverter::cmOutputConverter(&converter,(cmStateSnapshot *)&local_1d0);
    cmOutputConverter::EscapeForShell(&local_1d0,&converter,&fw,false,false,false);
    std::__cxx11::string::operator=((string *)&fw,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    local_1d0._M_dataplus._M_p._0_1_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&fw,(bool *)&local_1d0);
    std::__cxx11::string::~string((string *)&full_fw);
    std::__cxx11::string::~string((string *)&fw);
    std::__cxx11::string::~string((string *)&fw_path);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fw_path);
    poVar2 = std::operator<<((ostream *)&fw_path,"Could not parse framework path \"");
    poVar2 = std::operator<<(poVar2,(string *)item);
    poVar2 = std::operator<<(poVar2,"\" ");
    poVar2 = std::operator<<(poVar2,"linked by target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,".");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&fw);
    std::__cxx11::string::~string((string *)&fw);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fw_path);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(std::string const& item)
{
  // Try to separate the framework name and path.
  if (!this->SplitFramework.find(item)) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str());
    return;
  }

  std::string fw_path = this->SplitFramework.match(1);
  std::string fw = this->SplitFramework.match(2);
  std::string full_fw = fw_path;
  full_fw += "/";
  full_fw += fw;
  full_fw += ".framework";
  full_fw += "/";
  full_fw += fw;

  // Add the directory portion to the framework search path.
  this->AddFrameworkPath(fw_path);

  // add runtime information
  this->AddLibraryRuntimeInfo(full_fw);

  // Add the item using the -framework option.
  this->Items.emplace_back("-framework", false);
  cmOutputConverter converter(this->Makefile->GetStateSnapshot());
  fw = converter.EscapeForShell(fw);
  this->Items.emplace_back(fw, false);
}